

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tga.cpp
# Opt level: O2

Image * rw::readTGA(char *filename)

{
  uint8 uVar1;
  uint8 *__file;
  Image *this;
  ulong uVar2;
  uint uVar3;
  size_t __nbytes;
  void *__buf;
  int x;
  uint depth;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint8 *puVar7;
  uint8 *puVar8;
  int y;
  int iVar9;
  ulong uVar10;
  TGAHeader header;
  uint32 length;
  StreamMemory local_50;
  
  __file = getFileContents(filename,&length);
  local_50.super_Stream._vptr_Stream = (_func_int **)&PTR__Stream_00142c70;
  __nbytes = 0;
  StreamMemory::open(&local_50,(char *)__file,length);
  TGAHeader::read(&header,(int)&local_50,__buf,__nbytes);
  StreamMemory::seek(&local_50,(int)header.IDlen,1);
  if (header.colorMapType == '\0') {
    depth = (uint)header.depth;
  }
  else {
    depth = (uint)(0x10 < header.colorMapLength) * 4 + 4;
  }
  uVar6 = (ulong)(uint)(int)header.height;
  this = Image::create((int)header.width,(int)header.height,depth);
  Image::allocate(this);
  if ((header.colorMapType != '\0') && (puVar7 = this->palette, puVar7 != (uint8 *)0x0)) {
    uVar3 = 0x100;
    if (depth == 4) {
      uVar3 = 0x10;
    }
    uVar5 = 0;
    if (header.colorMapLength < 1) {
      header.colorMapLength = 0;
    }
    uVar10 = (ulong)(ushort)header.colorMapLength;
    for (; uVar10 != uVar5; uVar5 = uVar5 + 1) {
      uVar1 = Stream::readU8(&local_50.super_Stream);
      puVar7[uVar5 * 4 + 2] = uVar1;
      uVar1 = Stream::readU8(&local_50.super_Stream);
      puVar7[uVar5 * 4 + 1] = uVar1;
      uVar1 = Stream::readU8(&local_50.super_Stream);
      puVar7[uVar5 * 4] = uVar1;
      puVar7[uVar5 * 4 + 3] = 0xff;
      if (header.colorMapType != '\0' && header.colorMapDepth == ' ') {
        uVar1 = Stream::readU8(&local_50.super_Stream);
        puVar7[uVar5 * 4 + 3] = uVar1;
      }
    }
    uVar2 = (ulong)uVar3;
    if (uVar3 < uVar5) {
      uVar2 = uVar5;
    }
    for (; uVar2 != uVar10; uVar10 = uVar10 + 1) {
      puVar8 = puVar7 + uVar10 * 4;
      puVar8[0] = '\0';
      puVar8[1] = '\0';
      puVar8[2] = '\0';
      puVar8[3] = 0xff;
    }
  }
  puVar7 = this->pixels;
  if ((header.descriptor & 0x20) == 0) {
    puVar7 = puVar7 + (long)this->stride * ((long)this->height + -1);
  }
  iVar9 = 0;
  do {
    if (this->height <= iVar9) {
      StreamMemory::close(&local_50,(int)uVar6);
      (*DAT_00143840)(__file);
      return this;
    }
    puVar8 = puVar7;
    for (iVar4 = 0; iVar4 < this->width; iVar4 = iVar4 + 1) {
      switch(this->depth << 0x1e | this->depth - 4U >> 2) {
      case 3:
        uVar1 = Stream::readU8(&local_50.super_Stream);
        *puVar8 = uVar1;
        uVar1 = Stream::readU8(&local_50.super_Stream);
        puVar8[1] = uVar1;
        break;
      case 5:
        uVar1 = Stream::readU8(&local_50.super_Stream);
        puVar8[2] = uVar1;
        uVar1 = Stream::readU8(&local_50.super_Stream);
        puVar8[1] = uVar1;
      case 0:
      case 1:
        uVar1 = Stream::readU8(&local_50.super_Stream);
        *puVar8 = uVar1;
        break;
      case 7:
        uVar1 = Stream::readU8(&local_50.super_Stream);
        puVar8[2] = uVar1;
        uVar1 = Stream::readU8(&local_50.super_Stream);
        puVar8[1] = uVar1;
        uVar1 = Stream::readU8(&local_50.super_Stream);
        *puVar8 = uVar1;
        uVar1 = Stream::readU8(&local_50.super_Stream);
        puVar8[3] = uVar1;
      }
      puVar8 = puVar8 + this->bpp;
    }
    iVar4 = -this->stride;
    if ((header.descriptor & 0x20) != 0) {
      iVar4 = this->stride;
    }
    puVar7 = puVar7 + iVar4;
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

Image*
readTGA(const char *filename)
{
	TGAHeader header;
	Image *image;
	int depth = 0, palDepth = 0;
	uint32 length;
	uint8 *data = getFileContents(filename, &length);
	assert(data != nil);
	StreamMemory file;
	file.open(data, length);
	header.read(&file);

	assert(header.imageType == 1 || header.imageType == 2);
	file.seek(header.IDlen);
	if(header.colorMapType){
		assert(header.colorMapOrigin == 0);
		depth = (header.colorMapLength <= 16) ? 4 : 8;
		palDepth = header.colorMapDepth;
		assert(palDepth == 24 || palDepth == 32);
	}else{
		depth = header.depth;
		assert(depth == 16 || depth == 24 || depth == 32);
	}

	image = Image::create(header.width, header.height, depth);
	image->allocate();
	uint8 *palette = header.colorMapType ? image->palette : nil;
	uint8 (*color)[4] = nil;
	if(palette){
		int maxlen = depth == 4 ? 16 : 256;
		color = (uint8(*)[4])palette;
		int i;
		for(i = 0; i < header.colorMapLength; i++){
			color[i][2] = file.readU8();
			color[i][1] = file.readU8();
			color[i][0] = file.readU8();
			color[i][3] = 0xFF;
			if(palDepth == 32)
				color[i][3] = file.readU8();
		}
		for(; i < maxlen; i++){
			color[i][0] = color[i][1] = color[i][2] = 0;
			color[i][3] = 0xFF;
		}
	}

	uint8 *pixels = image->pixels;
	if(!(header.descriptor & 0x20))
		pixels += (image->height-1)*image->stride;
	for(int y = 0; y < image->height; y++){
		uint8 *line = pixels;
		for(int x = 0; x < image->width; x++){
			switch(image->depth){
			case 4:
			case 8:
				line[0] = file.readU8();
				break;
			case 16:
				line[0] = file.readU8();
				line[1] = file.readU8();
				break;
			case 24:
				line[2] = file.readU8();
				line[1] = file.readU8();
				line[0] = file.readU8();
				break;
			case 32:
				line[2] = file.readU8();
				line[1] = file.readU8();
				line[0] = file.readU8();
				line[3] = file.readU8();
				break;
			}
			line += image->bpp;
		}
		pixels += (header.descriptor&0x20) ?
		              image->stride : -image->stride;
	}

	file.close();
	rwFree(data);
	return image;
}